

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb_to_utf8(char *buffer,stb__wchar *str,int n)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          uVar1 = *str;
          if (uVar1 == 0) {
            buffer[iVar3] = '\0';
            return buffer;
          }
          if (0x7f < uVar1) break;
          if (n + -1 <= iVar3) {
            return (char *)0x0;
          }
          str = str + 1;
          buffer[iVar3] = (char)uVar1;
          iVar3 = iVar3 + 1;
        }
        if (0x7ff < uVar1) break;
        if (n <= iVar3 + 2) {
          return (char *)0x0;
        }
        buffer[iVar3] = (byte)(uVar1 >> 6) | 0xc0;
        buffer[(long)iVar3 + 1] = (byte)*str & 0x3f | 0x80;
        str = str + 1;
        iVar3 = iVar3 + 2;
      }
      if ((uVar1 & 0xfc00) != 0xd800) break;
      if (n <= iVar3 + 4) {
        return (char *)0x0;
      }
      uVar2 = str[1];
      uVar4 = (uint)uVar1 * 0x400 + (uint)uVar2 + 0xfca02400;
      buffer[iVar3] = (char)(uVar4 >> 0x12) + -0x10;
      buffer[(long)iVar3 + 1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
      buffer[(long)iVar3 + 2] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
      buffer[(long)iVar3 + 3] = (byte)uVar2 & 0x3f | 0x80;
      str = str + 2;
      iVar3 = iVar3 + 4;
    }
    if ((uVar1 & 0xfc00) == 0xdc00) {
      return (char *)0x0;
    }
    if (n <= iVar3 + 3) break;
    buffer[iVar3] = (byte)(uVar1 >> 0xc) | 0xe0;
    buffer[(long)iVar3 + 1] = (byte)(*str >> 6) & 0x3f | 0x80;
    buffer[(long)iVar3 + 2] = (byte)*str & 0x3f | 0x80;
    str = str + 1;
    iVar3 = iVar3 + 3;
  }
  return (char *)0x0;
}

Assistant:

char * stb_to_utf8(char *buffer, stb__wchar *str, int n)
{
   int i=0;
   --n;
   while (*str) {
      if (*str < 0x80) {
         if (i+1 > n) return NULL;
         buffer[i++] = (char) *str++;
      } else if (*str < 0x800) {
         if (i+2 > n) return NULL;
         buffer[i++] = 0xc0 + (*str >> 6);
         buffer[i++] = 0x80 + (*str & 0x3f);
         str += 1;
      } else if (*str >= 0xd800 && *str < 0xdc00) {
         stb_uint32 c;
         if (i+4 > n) return NULL;
         c = ((str[0] - 0xd800) << 10) + ((str[1]) - 0xdc00) + 0x10000;
         buffer[i++] = 0xf0 + (c >> 18);
         buffer[i++] = 0x80 + ((c >> 12) & 0x3f);
         buffer[i++] = 0x80 + ((c >>  6) & 0x3f);
         buffer[i++] = 0x80 + ((c      ) & 0x3f);
         str += 2;
      } else if (*str >= 0xdc00 && *str < 0xe000) {
         return NULL;
      } else {
         if (i+3 > n) return NULL;
         buffer[i++] = 0xe0 + (*str >> 12);
         buffer[i++] = 0x80 + ((*str >> 6) & 0x3f);
         buffer[i++] = 0x80 + ((*str     ) & 0x3f);
         str += 1;
      }
   }
   buffer[i] = 0;
   return buffer;
}